

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

void __thiscall QPDF::linearizationWarning(QPDF *this,string_view msg)

{
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  string_view msg_local;
  
  msg_local._M_str = msg._M_str;
  msg_local._M_len = msg._M_len;
  ((this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
   super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->linearization_warnings = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_61);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_60,&msg_local,&local_62);
  warn(this,qpdf_e_linearization,&local_40,0,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void
QPDF::linearizationWarning(std::string_view msg)
{
    m->linearization_warnings = true;
    warn(qpdf_e_linearization, "", 0, std::string(msg));
}